

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O2

void __thiscall xercesc_4_0::XMLUri::initialize(XMLUri *this,XMLUri *baseURI,XMLCh *uriSpec)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  XMLCh *pXVar7;
  XMLSize_t XVar8;
  XMLCh *pXVar9;
  undefined4 extraout_var_00;
  XMLSize_t XVar10;
  XMLSize_t XVar11;
  undefined4 extraout_var_01;
  XMLCh *toDelete;
  XMLCh *toDelete_00;
  MalformedURLException *pMVar12;
  ulong uVar13;
  ulong startIndex;
  ArrayJanitor<char16_t> tmp2Name;
  ArrayJanitor<char16_t> tmp1Name;
  ArrayJanitor<char16_t> pathName;
  ArrayJanitor<char16_t> basePathName;
  ArrayJanitor<char16_t> pathUriSpecName;
  ArrayJanitor<char16_t> authName;
  ArrayJanitor<char16_t> janName;
  undefined4 extraout_var;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  
  pXVar7 = XMLString::replicate(uriSpec,this->fMemoryManager);
  XMLString::trim(pXVar7);
  ArrayJanitor<char16_t>::ArrayJanitor(&janName,pXVar7,this->fMemoryManager);
  XVar8 = XMLString::stringLen(pXVar7);
  if ((baseURI == (XMLUri *)0x0) && ((pXVar7 == (XMLCh *)0x0 || (XVar8 == 0)))) {
    pMVar12 = (MalformedURLException *)__cxa_allocate_exception(0x30);
    MalformedURLException::MalformedURLException
              (pMVar12,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
               ,0x191,XMLNUM_URI_Component_Empty,(XMLCh *)errMsg_PARAMS,(XMLCh *)0x0,(XMLCh *)0x0,
               (XMLCh *)0x0,this->fMemoryManager);
    __cxa_throw(pMVar12,&MalformedURLException::typeinfo,XMLException::~XMLException);
  }
  if (pXVar7 == (XMLCh *)0x0 || XVar8 == 0) {
    initialize(this,baseURI);
    goto LAB_00268c6a;
  }
  iVar3 = XMLString::indexOf(pXVar7,L':');
  iVar4 = XMLString::indexOf(pXVar7,L'/');
  iVar5 = XMLString::indexOf(pXVar7,L'?');
  iVar6 = XMLString::indexOf(pXVar7,L'#');
  if (iVar3 < 1) {
    if ((iVar3 != 0) && (baseURI != (XMLUri *)0x0 || iVar6 == 0)) {
LAB_002685ec:
      XVar10 = 0;
      goto LAB_002685ef;
    }
  }
  else {
    if ((iVar3 <= iVar4 || iVar4 == -1) &&
       ((iVar3 <= iVar5 || iVar5 == -1 && (iVar3 <= iVar6 || iVar6 == -1)))) {
      initializeScheme(this,pXVar7);
      XVar11 = XMLString::stringLen(this->fScheme);
      XVar10 = XVar11 + 1;
      if ((XVar10 == XVar8) || (pXVar7[XVar11 + 1] == L'#')) {
        pMVar12 = (MalformedURLException *)__cxa_allocate_exception(0x30);
        MalformedURLException::MalformedURLException
                  (pMVar12,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                   ,0x1bc,XMLNUM_URI_Component_Empty,(XMLCh *)errMsg_PATH,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0,this->fMemoryManager);
        goto LAB_00268cb1;
      }
LAB_002685ef:
      lVar1 = XVar8 * 2 + 2;
      iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,lVar1);
      pXVar9 = (XMLCh *)CONCAT44(extraout_var,iVar3);
      ArrayJanitor<char16_t>::ArrayJanitor(&authName,pXVar9,this->fMemoryManager);
      XMLString::subString(pXVar9,pXVar7,XVar10,XVar8,this->fMemoryManager);
      if ((XVar10 + 1 < XVar8) && (bVar2 = XMLString::startsWith(pXVar9,L"//"), bVar2)) {
        startIndex = XVar10 + 2;
        uVar13 = startIndex;
        while ((XVar10 = XVar8, uVar13 < XVar8 &&
               ((0x3f < (ulong)(ushort)pXVar7[uVar13] ||
                (XVar10 = uVar13,
                (0x8000800800000000U >> ((ulong)(ushort)pXVar7[uVar13] & 0x3f) & 1) == 0))))) {
          uVar13 = uVar13 + 1;
        }
        if (startIndex < XVar10) {
          XMLString::subString(pXVar9,pXVar7,startIndex,XVar10,this->fMemoryManager);
          initializeAuthority(this,pXVar9);
        }
        else {
          setHost(this,L"");
        }
      }
      if (XVar10 < XVar8) {
        iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,lVar1);
        pXVar9 = (XMLCh *)CONCAT44(extraout_var_00,iVar3);
        ArrayJanitor<char16_t>::ArrayJanitor(&pathUriSpecName,pXVar9,this->fMemoryManager);
        XMLString::subString(pXVar9,pXVar7,XVar10,XVar8,this->fMemoryManager);
        initializePath(this,pXVar9);
        if (baseURI != (XMLUri *)0x0) {
          if ((this->fPath == (XMLCh *)0x0) || (*this->fPath == L'\0')) {
            if (this->fScheme == (XMLCh *)0x0) {
              if ((this->fHost != (XMLCh *)0x0) || (this->fRegAuth != (XMLCh *)0x0))
              goto LAB_0026871c;
              pXVar7 = XMLString::replicate(baseURI->fScheme,this->fMemoryManager);
              this->fScheme = pXVar7;
              (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fUserInfo);
              pXVar7 = XMLString::replicate(baseURI->fUserInfo,this->fMemoryManager);
              this->fUserInfo = pXVar7;
              pXVar7 = XMLString::replicate(baseURI->fHost,this->fMemoryManager);
              this->fHost = pXVar7;
              this->fPort = baseURI->fPort;
              pXVar7 = XMLString::replicate(baseURI->fRegAuth,this->fMemoryManager);
              this->fRegAuth = pXVar7;
              (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPath);
              pXVar7 = XMLString::replicate(baseURI->fPath,this->fMemoryManager);
              this->fPath = pXVar7;
              if (this->fQueryString == (XMLCh *)0x0) {
                pXVar7 = XMLString::replicate(baseURI->fQueryString,this->fMemoryManager);
                this->fQueryString = pXVar7;
              }
            }
          }
          else if (this->fScheme == (XMLCh *)0x0) {
LAB_0026871c:
            pXVar7 = XMLString::replicate(baseURI->fScheme,this->fMemoryManager);
            this->fScheme = pXVar7;
            if ((this->fHost == (XMLCh *)0x0) && (this->fRegAuth == (XMLCh *)0x0)) {
              (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fUserInfo);
              pXVar7 = XMLString::replicate(baseURI->fUserInfo,this->fMemoryManager);
              this->fUserInfo = pXVar7;
              pXVar7 = XMLString::replicate(baseURI->fHost,this->fMemoryManager);
              this->fHost = pXVar7;
              this->fPort = baseURI->fPort;
              pXVar7 = XMLString::replicate(baseURI->fRegAuth,this->fMemoryManager);
              this->fRegAuth = pXVar7;
              pXVar7 = this->fPath;
              if ((pXVar7 == (XMLCh *)0x0) ||
                 ((*pXVar7 == L'\0' || (bVar2 = XMLString::startsWith(pXVar7,L"/"), !bVar2)))) {
                pXVar7 = XMLString::replicate(baseURI->fPath,this->fMemoryManager);
                ArrayJanitor<char16_t>::ArrayJanitor(&basePathName,pXVar7,this->fMemoryManager);
                XVar10 = XMLString::stringLen(this->fPath);
                XVar11 = XMLString::stringLen(pXVar7);
                lVar1 = (XVar11 + XVar10 + XVar8) * 2 + 2;
                iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,lVar1);
                pXVar9 = (XMLCh *)CONCAT44(extraout_var_01,iVar3);
                ArrayJanitor<char16_t>::ArrayJanitor(&pathName,pXVar9,this->fMemoryManager);
                *pXVar9 = L'\0';
                iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,lVar1);
                toDelete = (XMLCh *)CONCAT44(extraout_var_02,iVar3);
                ArrayJanitor<char16_t>::ArrayJanitor(&tmp1Name,toDelete,this->fMemoryManager);
                iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,lVar1);
                toDelete_00 = (XMLCh *)CONCAT44(extraout_var_03,iVar3);
                ArrayJanitor<char16_t>::ArrayJanitor(&tmp2Name,toDelete_00,this->fMemoryManager);
                if ((pXVar7 != (XMLCh *)0x0) &&
                   (iVar3 = XMLString::lastIndexOf(pXVar7,L'/'), iVar3 != -1)) {
                  XMLString::subString(pXVar9,pXVar7,0,(long)(iVar3 + 1),this->fMemoryManager);
                }
                XMLString::catString(pXVar9,this->fPath);
                while (iVar3 = XMLString::patternMatch(pXVar9,L"/./"), iVar3 != -1) {
                  XMLString::subString(toDelete,pXVar9,0,(long)iVar3,this->fMemoryManager);
                  XVar8 = XMLString::stringLen(pXVar9);
                  XMLString::subString
                            (toDelete_00,pXVar9,(long)(iVar3 + 2),XVar8,this->fMemoryManager);
                  *pXVar9 = L'\0';
                  XMLString::catString(pXVar9,toDelete);
                  XMLString::catString(pXVar9,toDelete_00);
                }
                bVar2 = XMLString::endsWith(pXVar9,L"/.");
                if (bVar2) {
                  XVar8 = XMLString::stringLen(pXVar9);
                  pXVar9[XVar8 - 1] = L'\0';
                }
                iVar3 = 1;
LAB_00268a0e:
                do {
                  iVar4 = XMLString::patternMatch(pXVar9 + iVar3,(XMLCh *)SLASH_DOTDOT_SLASH);
                  if (iVar4 == -1) goto LAB_00268ae8;
                  XMLString::subString
                            (toDelete,pXVar9,0,(long)(iVar4 + -1 + iVar3),this->fMemoryManager);
                  iVar5 = XMLString::lastIndexOf(toDelete,L'/');
                  if (iVar5 != -1) {
                    XVar8 = (XMLSize_t)iVar5;
                    if (((pXVar9[XVar8 + 1] != L'.') || (pXVar9[XVar8 + 2] != L'.')) ||
                       (iVar5 + 3 != iVar4 + iVar3)) {
                      XMLString::subString(toDelete,pXVar9,0,XVar8,this->fMemoryManager);
                      XVar8 = XMLString::stringLen(pXVar9);
                      XMLString::subString
                                (toDelete_00,pXVar9,(long)(iVar4 + iVar3 + 3),XVar8,
                                 this->fMemoryManager);
                      *pXVar9 = L'\0';
                      XMLString::catString(pXVar9,toDelete);
                      XMLString::catString(pXVar9,toDelete_00);
                      iVar3 = iVar5 + (uint)(iVar5 == 0);
                      goto LAB_00268a0e;
                    }
                  }
                  iVar3 = iVar3 + 4;
                } while( true );
              }
            }
          }
        }
LAB_00268c56:
        ArrayJanitor<char16_t>::~ArrayJanitor(&pathUriSpecName);
      }
      ArrayJanitor<char16_t>::~ArrayJanitor(&authName);
LAB_00268c6a:
      ArrayJanitor<char16_t>::~ArrayJanitor(&janName);
      return;
    }
    if (iVar6 == 0 || baseURI != (XMLUri *)0x0) goto LAB_002685ec;
  }
  pMVar12 = (MalformedURLException *)__cxa_allocate_exception(0x30);
  MalformedURLException::MalformedURLException
            (pMVar12,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
             ,0x1ac,XMLNUM_URI_No_Scheme,this->fMemoryManager);
LAB_00268cb1:
  __cxa_throw(pMVar12,&MalformedURLException::typeinfo,XMLException::~XMLException);
LAB_00268ae8:
  bVar2 = XMLString::endsWith(pXVar9,L"/..");
  if (bVar2) {
    XVar8 = XMLString::stringLen(pXVar9);
    XMLString::subString(toDelete,pXVar9,0,XVar8 - 4,this->fMemoryManager);
    iVar3 = XMLString::lastIndexOf(toDelete,L'/');
    if ((iVar3 != -1) &&
       (((pXVar9[(long)iVar3 + 1] != L'.' || (iVar3 != (int)XVar8 + -6)) ||
        (pXVar9[(long)iVar3 + 2] != L'.')))) {
      pXVar9[(long)iVar3 + 1] = L'\0';
    }
  }
  if (this->fPath != (XMLCh *)0x0) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])();
  }
  pXVar7 = XMLString::replicate(pXVar9,this->fMemoryManager);
  this->fPath = pXVar7;
  ArrayJanitor<char16_t>::~ArrayJanitor(&tmp2Name);
  ArrayJanitor<char16_t>::~ArrayJanitor(&tmp1Name);
  ArrayJanitor<char16_t>::~ArrayJanitor(&pathName);
  ArrayJanitor<char16_t>::~ArrayJanitor(&basePathName);
  goto LAB_00268c56;
}

Assistant:

void XMLUri::initialize(const XMLUri* const baseURI
                      , const XMLCh*  const uriSpec)
{

    // get a trimmed version of uriSpec
    // uriSpec will NO LONGER be used in this function.
    //
    XMLCh* trimmedUriSpec = XMLString::replicate(uriSpec, fMemoryManager);
    XMLString::trim(trimmedUriSpec);
    ArrayJanitor<XMLCh> janName(trimmedUriSpec, fMemoryManager);
    XMLSize_t trimmedUriSpecLen = XMLString::stringLen(trimmedUriSpec);

    if ( !baseURI &&
        (!trimmedUriSpec || trimmedUriSpecLen == 0))
    {
        ThrowXMLwithMemMgr1(MalformedURLException
               , XMLExcepts::XMLNUM_URI_Component_Empty
               , errMsg_PARAMS
               , fMemoryManager);
    }

	// just make a copy of the base if spec is empty
	if (!trimmedUriSpec || trimmedUriSpecLen == 0)
    {
        initialize(*baseURI);
        return;
	}

	XMLSize_t index = 0;
	bool foundScheme = false;

	// Check for scheme, which must be before `/', '?' or '#'.
        int colonIdx = XMLString::indexOf(trimmedUriSpec, chColon);
        int slashIdx = XMLString::indexOf(trimmedUriSpec, chForwardSlash);
        int queryIdx = XMLString::indexOf(trimmedUriSpec, chQuestion);
        int fragmentIdx = XMLString::indexOf(trimmedUriSpec, chPound);

        if ((colonIdx <= 0) ||
            (colonIdx > slashIdx && slashIdx != -1) ||
            (colonIdx > queryIdx && queryIdx != -1) ||
            (colonIdx > fragmentIdx && fragmentIdx != -1))
        {
            // A standalone base is a valid URI according to spec
            if ( colonIdx == 0 || (!baseURI && fragmentIdx != 0) )
            {
                ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::XMLNUM_URI_No_Scheme, fMemoryManager);
            }
        }
        else
        {
            foundScheme = true;
            initializeScheme(trimmedUriSpec);
            index = XMLString::stringLen(fScheme)+1;
        }

    // It's an error if we stop here
    if (index == trimmedUriSpecLen || (foundScheme && (trimmedUriSpec[index] == chPound)))
    {
        ThrowXMLwithMemMgr1(MalformedURLException
                , XMLExcepts::XMLNUM_URI_Component_Empty
                , errMsg_PATH
                , fMemoryManager);
    }

	// two slashes means generic URI syntax, so we get the authority
    XMLCh* authUriSpec = (XMLCh*) fMemoryManager->allocate
    (
        (trimmedUriSpecLen+1) * sizeof(XMLCh)
    );//new XMLCh[trimmedUriSpecLen+1];
    ArrayJanitor<XMLCh> authName(authUriSpec, fMemoryManager);
    XMLString::subString(authUriSpec, trimmedUriSpec, index, trimmedUriSpecLen, fMemoryManager);

    if (((index+1) < trimmedUriSpecLen) &&
        XMLString::startsWith(authUriSpec, DOUBLE_SLASH))
    {
        index += 2;
        XMLSize_t startPos = index;

        // get authority - everything up to path, query or fragment
        XMLCh testChar;
        while (index < trimmedUriSpecLen)
        {
            testChar = trimmedUriSpec[index];
            if (testChar == chForwardSlash ||
                testChar == chQuestion     ||
                testChar == chPound         )
            {
                break;
            }

            index++;
        }

        // if we found authority, parse it out, otherwise we set the
        // host to empty string
        if (index > startPos)
        {
            XMLString::subString(authUriSpec, trimmedUriSpec, startPos, index, fMemoryManager);
            initializeAuthority(authUriSpec);
        }
        else
        {
            //fHost = 0;
            setHost(XMLUni::fgZeroLenString);
        }
    }

    // we need to check if index has exceed the lenght or not
    if (index >= trimmedUriSpecLen)
        return;

    XMLCh* pathUriSpec = (XMLCh*) fMemoryManager->allocate
    (
        (trimmedUriSpecLen+1) * sizeof(XMLCh)
    );//new XMLCh[trimmedUriSpecLen+1];
    ArrayJanitor<XMLCh> pathUriSpecName(pathUriSpec, fMemoryManager);
    XMLString::subString(pathUriSpec, trimmedUriSpec, index, trimmedUriSpecLen, fMemoryManager);

	initializePath(pathUriSpec);

	// Resolve relative URI to base URI - see RFC 2396 Section 5.2
	// In some cases, it might make more sense to throw an exception
	// (when scheme is specified is the string spec and the base URI
	// is also specified, for example), but we're just following the
	// RFC specifications
	if ( baseURI )
    {
        // check to see if this is the current doc - RFC 2396 5.2 #2
        // note that this is slightly different from the RFC spec in that
        // we don't include the check for query string being null
        // - this handles cases where the urispec is just a query
        // string or a fragment (e.g. "?y" or "#s") -
        // see <http://www.ics.uci.edu/~fielding/url/test1.html> which
        // identified this as a bug in the RFC
        if ((!fPath || !*fPath) &&
            fScheme == 0 &&
            fHost == 0 && fRegAuth == 0)
        {
            fScheme = XMLString::replicate(baseURI->getScheme(), fMemoryManager);
            fMemoryManager->deallocate(fUserInfo);//delete [] fUserInfo;
            fUserInfo = XMLString::replicate(baseURI->getUserInfo(), fMemoryManager);
            fHost = XMLString::replicate(baseURI->getHost(), fMemoryManager);
            fPort = baseURI->getPort();
            fRegAuth = XMLString::replicate(baseURI->getRegBasedAuthority(), fMemoryManager);
            fMemoryManager->deallocate(fPath);//delete [] fPath;
            fPath = XMLString::replicate(baseURI->getPath(), fMemoryManager);

            if ( !fQueryString )
            {
                fQueryString = XMLString::replicate(baseURI->getQueryString(), fMemoryManager);
            }
            return;
        }

        // check for scheme - RFC 2396 5.2 #3
        // if we found a scheme, it means absolute URI, so we're done
        if (fScheme == 0)
        {
            fScheme = XMLString::replicate(baseURI->getScheme(), fMemoryManager);
        }
        else
        {
            return;
        }

        // check for authority - RFC 2396 5.2 #4
        // if we found a host, then we've got a network path, so we're done
        if (fHost == 0 && fRegAuth == 0)
        {
            fMemoryManager->deallocate(fUserInfo);//delete [] fUserInfo;
            fUserInfo = XMLString::replicate(baseURI->getUserInfo(), fMemoryManager);
            fHost = XMLString::replicate(baseURI->getHost(), fMemoryManager);
            fPort = baseURI->getPort();
            fRegAuth = XMLString::replicate(baseURI->getRegBasedAuthority(), fMemoryManager);
        }
        else
        {
            return;
        }

        // check for absolute path - RFC 2396 5.2 #5
        if ((fPath && *fPath) &&
            XMLString::startsWith(fPath, SINGLE_SLASH))
        {
            return;
        }

        // if we get to this point, we need to resolve relative path
        // RFC 2396 5.2 #6

        XMLCh* basePath = XMLString::replicate(baseURI->getPath(), fMemoryManager);
        ArrayJanitor<XMLCh> basePathName(basePath, fMemoryManager);

        XMLSize_t bufLen = trimmedUriSpecLen+XMLString::stringLen(fPath)+XMLString::stringLen(basePath)+1;
        XMLCh* path = (XMLCh*) fMemoryManager->allocate(bufLen * sizeof(XMLCh));//new XMLCh[bufLen];
        ArrayJanitor<XMLCh> pathName(path, fMemoryManager);
        path[0] = 0;

        XMLCh* tmp1 = (XMLCh*) fMemoryManager->allocate(bufLen * sizeof(XMLCh));//new XMLCh[bufLen];
        ArrayJanitor<XMLCh> tmp1Name(tmp1, fMemoryManager);
        XMLCh* tmp2 = (XMLCh*) fMemoryManager->allocate(bufLen * sizeof(XMLCh));//new XMLCh[bufLen];
        ArrayJanitor<XMLCh> tmp2Name(tmp2, fMemoryManager);

        // 6a - get all but the last segment of the base URI path
        if (basePath)
        {
            int lastSlash = XMLString::lastIndexOf(basePath, chForwardSlash);
            if (lastSlash != -1)
            {
                XMLString::subString(path, basePath, 0, lastSlash+1, fMemoryManager);
            }
        }

        // 6b - append the relative URI path
        XMLString::catString(path, fPath);

        // 6c - remove all "./" where "." is a complete path segment
        int iIndex = -1;
        while ((iIndex = XMLString::patternMatch(path, SLASH_DOT_SLASH)) != -1)
        {
            XMLString::subString(tmp1, path, 0, iIndex, fMemoryManager);
            XMLString::subString(tmp2, path, iIndex+2, XMLString::stringLen(path), fMemoryManager);

            path[0] = 0;
            XMLString::catString(path, tmp1);
            XMLString::catString(path, tmp2);
        }

        // 6d - remove "." if path ends with "." as a complete path segment
        if (XMLString::endsWith(path, SLASH_DOT))
        {
            path[XMLString::stringLen(path) - 1] = chNull;
        }

        // 6e - remove all "<segment>/../" where "<segment>" is a complete
        // path segment not equal to ".."
        iIndex = -1;
        int segIndex = -1;
        int offset = 1;

        while ((iIndex = XMLString::patternMatch(&(path[offset]), SLASH_DOTDOT_SLASH)) != -1)
        {
			// Undo offset
			iIndex += offset;

			// Find start of <segment> within substring ending at found point.
			XMLString::subString(tmp1, path, 0, iIndex-1, fMemoryManager);
			segIndex = XMLString::lastIndexOf(tmp1, chForwardSlash);

			// Ensure <segment> exists and != ".."
            if (segIndex != -1                &&
                (path[segIndex+1] != chPeriod ||
                 path[segIndex+2] != chPeriod ||
				 segIndex + 3 != iIndex))
            {

                XMLString::subString(tmp1, path, 0, segIndex, fMemoryManager);
                XMLString::subString(tmp2, path, iIndex+3, XMLString::stringLen(path), fMemoryManager);

                path[0] = 0;
                XMLString::catString(path, tmp1);
                XMLString::catString(path, tmp2);

                offset = (segIndex == 0 ? 1 : segIndex);
            }
            else
            {
                offset += 4;
            }
        }// while

        // 6f - remove ending "<segment>/.." where "<segment>" is a
        // complete path segment
        if (XMLString::endsWith(path, SLASH_DOTDOT))
        {
			// Find start of <segment> within substring ending at found point.
            index = XMLString::stringLen(path) - 3;
			XMLString::subString(tmp1, path, 0, index-1, fMemoryManager);
			segIndex = XMLString::lastIndexOf(tmp1, chForwardSlash);

            if (segIndex != -1                &&
                (path[segIndex+1] != chPeriod ||
                 path[segIndex+2] != chPeriod ||
				 segIndex + 3 != (int)index))
            {
                path[segIndex+1] = chNull;
            }
        }

        if (getPath())
            fMemoryManager->deallocate(fPath);//delete [] fPath;

        fPath = XMLString::replicate(path, fMemoryManager);

    }
}